

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void opj_mqc_erterm_enc(opj_mqc_t *mqc)

{
  int local_14;
  OPJ_INT32 k;
  opj_mqc_t *mqc_local;
  
  for (local_14 = 0xc - mqc->ct; 0 < local_14; local_14 = local_14 - mqc->ct) {
    mqc->c = mqc->c << ((byte)mqc->ct & 0x1f);
    mqc->ct = 0;
    opj_mqc_byteout(mqc);
  }
  if (*mqc->bp != 0xff) {
    opj_mqc_byteout(mqc);
  }
  return;
}

Assistant:

void opj_mqc_erterm_enc(opj_mqc_t *mqc)
{
    OPJ_INT32 k = (OPJ_INT32)(11 - mqc->ct + 1);

    while (k > 0) {
        mqc->c <<= mqc->ct;
        mqc->ct = 0;
        opj_mqc_byteout(mqc);
        k -= (OPJ_INT32)mqc->ct;
    }

    if (*mqc->bp != 0xff) {
        opj_mqc_byteout(mqc);
    }
}